

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O0

HRESULT __thiscall
Js::JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
          (StackFrame *this,LPCWSTR *outResult)

{
  bool bVar1;
  LPCWSTR functionName;
  FunctionBody *this_00;
  ScriptContext *scriptContext;
  HRESULT local_24;
  HRESULT hr;
  PCWSTR name;
  LPCWSTR *outResult_local;
  StackFrame *this_local;
  
  functionName = GetFunctionName(this);
  local_24 = 0;
  bVar1 = IsScriptFunction(this);
  if (bVar1) {
    this_00 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    local_24 = StackTraceArguments::ToString
                         (&this->argumentTypes,functionName,scriptContext,outResult);
  }
  else {
    *outResult = functionName;
  }
  return local_24;
}

Assistant:

HRESULT JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments(_In_ LPCWSTR *outResult) const
    {
        PCWSTR name = GetFunctionName();
        HRESULT hr = S_OK;
        if (IsScriptFunction())
        {
            hr = argumentTypes.ToString(name, functionBody->GetScriptContext(), outResult);
        }
        else
        {
            *outResult = name;
        }

        return hr;
    }